

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void gen_mir(c2m_ctx_t c2m_ctx,node_t_conflict r)

{
  MIR_op_t mir_op;
  MIR_op_t mir_op_00;
  MIR_op_t mir_op_01;
  MIR_module *pMVar1;
  MIR_context_t __dest;
  VARR_uint8_t **__dest_00;
  MIR_op_t local_178;
  op_t local_148;
  MIR_op_t local_108;
  op_t local_d8;
  MIR_op_t local_98;
  op_t local_68;
  MIR_context_t local_28;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  local_28 = c2m_ctx->ctx;
  gen_ctx = (gen_ctx_t_conflict)r;
  r_local = (node_t_conflict)c2m_ctx;
  __dest = (MIR_context_t)c2mir_calloc(c2m_ctx,0x1c0);
  r_local[10].u.ops.head = (node_t)__dest;
  ctx = __dest;
  MIR_new_int_op(&local_98,local_28,0);
  mir_op._8_8_ = local_98._8_8_;
  mir_op.data = local_98.data;
  mir_op.u.i = local_98.u.i;
  mir_op.u.str.s = local_98.u.str.s;
  mir_op.u._16_8_ = local_98.u._16_8_;
  mir_op.u.mem.disp = local_98.u.mem.disp;
  new_op(&local_68,(decl_t)0x0,mir_op);
  memcpy(__dest,&local_68,0x40);
  __dest_00 = &ctx->used_label_p;
  MIR_new_int_op(&local_108,local_28,1);
  mir_op_00._8_8_ = local_108._8_8_;
  mir_op_00.data = local_108.data;
  mir_op_00.u.i = local_108.u.i;
  mir_op_00.u.str.s = local_108.u.str.s;
  mir_op_00.u._16_8_ = local_108.u._16_8_;
  mir_op_00.u.mem.disp = local_108.u.mem.disp;
  new_op(&local_d8,(decl_t)0x0,mir_op_00);
  memcpy(__dest_00,&local_d8,0x40);
  pMVar1 = &ctx->environment_module;
  MIR_new_int_op(&local_178,local_28,-1);
  mir_op_01._8_8_ = local_178._8_8_;
  mir_op_01.data = local_178.data;
  mir_op_01.u.i = local_178.u.i;
  mir_op_01.u.str.s = local_178.u.str.s;
  mir_op_01.u._16_8_ = local_178.u._16_8_;
  mir_op_01.u.mem.disp = local_178.u.mem.disp;
  new_op(&local_148,(decl_t)0x0,mir_op_01);
  memcpy(&pMVar1->last_temp_item_num,&local_148,0x40);
  init_reg_vars((c2m_ctx_t)r_local);
  VARR_MIR_var_tcreate((VARR_MIR_var_t **)&ctx[1].temp_data,0x20);
  VARR_MIR_type_tcreate((VARR_MIR_type_t **)&ctx[1].temp_string,0x10);
  gen_mir_protos((c2m_ctx_t)r_local);
  VARR_MIR_op_tcreate((VARR_MIR_op_t **)&ctx[1].environment_module.items.tail,0x20);
  VARR_MIR_op_tcreate((VARR_MIR_op_t **)&ctx[1].environment_module.module_link,8);
  VARR_MIR_op_tcreate((VARR_MIR_op_t **)&ctx[1].environment_module.module_link.next,0x80);
  VARR_case_tcreate((VARR_case_t **)&ctx[1].environment_module.last_temp_item_num,0x40);
  VARR_init_el_tcreate((VARR_init_el_t **)&ctx[1].used_label_p,0x80);
  VARR_node_tcreate((VARR_node_t **)&ctx[1].curr_label_num,8);
  ctx[1].environment_module.items.head = (MIR_item_t_conflict)0x0;
  ctx[1].environment_module.name = (char *)0x0;
  ctx[1].environment_module.data = (void *)0x0;
  ctx[1].module_item_tab = (HTAB_MIR_item_t *)0x0;
  top_gen((c2m_ctx_t)r_local,(node_t_conflict)gen_ctx,(MIR_label_t)0x0,(MIR_label_t)0x0,(int *)0x0);
  gen_finish((c2m_ctx_t)r_local);
  return;
}

Assistant:

static void gen_mir (c2m_ctx_t c2m_ctx, node_t r) {
  gen_ctx_t gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;

  c2m_ctx->gen_ctx = gen_ctx = c2mir_calloc (c2m_ctx, sizeof (struct gen_ctx));
  zero_op = new_op (NULL, MIR_new_int_op (ctx, 0));
  one_op = new_op (NULL, MIR_new_int_op (ctx, 1));
  minus_one_op = new_op (NULL, MIR_new_int_op (ctx, -1));
  init_reg_vars (c2m_ctx);
  VARR_CREATE (MIR_var_t, proto_info.arg_vars, 32);
  VARR_CREATE (MIR_type_t, proto_info.ret_types, 16);
  gen_mir_protos (c2m_ctx);
  VARR_CREATE (MIR_op_t, call_ops, 32);
  VARR_CREATE (MIR_op_t, ret_ops, 8);
  VARR_CREATE (MIR_op_t, switch_ops, 128);
  VARR_CREATE (case_t, switch_cases, 64);
  VARR_CREATE (init_el_t, init_els, 128);
  VARR_CREATE (node_t, node_stack, 8);
  memset_proto = memset_item = memcpy_proto = memcpy_item = NULL;
  top_gen (c2m_ctx, r, NULL, NULL, NULL);
  gen_finish (c2m_ctx);
}